

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_handle.cpp
# Opt level: O1

void __thiscall duckdb::CSVFileHandle::Seek(CSVFileHandle *this,idx_t position)

{
  bool bVar1;
  pointer this_00;
  InternalException *this_01;
  string local_40;
  
  if (this->can_seek != false) {
    this_00 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
              operator->(&this->file_handle);
    FileHandle::Seek(this_00,position);
    return;
  }
  bVar1 = this->is_pipe;
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  if (bVar1 == true) {
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Trying to seek a piped CSV File.","");
    InternalException::InternalException(this_01,&local_40);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Trying to seek a compressed CSV File.","");
  InternalException::InternalException(this_01,&local_40);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CSVFileHandle::Seek(const idx_t position) const {
	if (!can_seek) {
		if (is_pipe) {
			throw InternalException("Trying to seek a piped CSV File.");
		}
		throw InternalException("Trying to seek a compressed CSV File.");
	}
	file_handle->Seek(position);
}